

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O3

void __thiscall helics::ValueFederate::~ValueFederate(ValueFederate *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  Federate *this_00;
  
  p_Var2 = this->_vptr_ValueFederate[-3];
  p_Var1 = (_func_int *)((long)&this->_vptr_ValueFederate + (long)p_Var2);
  this_00 = (Federate *)(p_Var1 + 0x10);
  *(undefined8 *)p_Var1 = 0x4baee8;
  this_00->_vptr_Federate = (_func_int **)0x4bafb8;
  std::unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ::~unique_ptr((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                 *)(p_Var2 + (long)&(this->vfManager)._M_t));
  Federate::~Federate(this_00);
  return;
}

Assistant:

void ValueFederate::loadFederateData()
{
    vfManager = std::make_unique<ValueFederateManager>(coreObject.get(),
                                                       this,
                                                       getID(),
                                                       singleThreadFederate);
    vfManager->useJsonSerialization = useJsonSerialization;
    if (!configFile.empty()) {
        ValueFederate::registerValueInterfaces(configFile);
    }
}